

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O0

bool isDehFile(int lumpnum)

{
  int iVar1;
  char *pcVar2;
  char *__s1;
  bool local_22;
  bool local_21;
  char *extension;
  char *fullName;
  int lumpnum_local;
  
  pcVar2 = FWadCollection::GetLumpFullName(&Wads,lumpnum);
  __s1 = strrchr(pcVar2,0x2e);
  local_21 = false;
  if (__s1 != (char *)0x0) {
    pcVar2 = strchr(pcVar2,0x2f);
    local_21 = false;
    if (pcVar2 == (char *)0x0) {
      iVar1 = strcasecmp(__s1,".deh");
      local_22 = true;
      if (iVar1 != 0) {
        iVar1 = strcasecmp(__s1,".bex");
        local_22 = iVar1 == 0;
      }
      local_21 = local_22;
    }
  }
  return local_21;
}

Assistant:

static bool isDehFile(int lumpnum)
{
	const char* const fullName  = Wads.GetLumpFullName(lumpnum);
	const char* const extension = strrchr(fullName, '.');

	return NULL != extension && strchr(fullName, '/') == NULL
		&& (0 == stricmp(extension, ".deh") || 0 == stricmp(extension, ".bex"));
}